

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_simple_key<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  char_type_conflict cVar1;
  bool bVar2;
  value_type *v;
  context<toml::type_config> *in_RDX;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  *in_RDI;
  context<toml::type_config> *in_stack_00000020;
  location *in_stack_00000028;
  string postfix;
  region bare;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  str_res_1;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  str_res;
  spec *spec;
  location *in_stack_fffffffffffffae8;
  region *in_stack_fffffffffffffaf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  location *in_stack_fffffffffffffb08;
  location *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  allocator<char> *in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffb48;
  source_location in_stack_fffffffffffffb50;
  spec *in_stack_fffffffffffffbb8;
  allocator<char> local_431 [161];
  location *in_stack_fffffffffffffc70;
  repeat_at_least *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string *in_stack_fffffffffffffd40;
  location *in_stack_fffffffffffffd48;
  repeat_at_least *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  local_1d8;
  undefined **local_148;
  context<toml::type_config> *in_stack_fffffffffffffee0;
  location *in_stack_fffffffffffffee8;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  local_b0;
  spec *local_20;
  
  local_20 = context<toml::type_config>::toml_spec(in_RDX);
  cVar1 = location::current(in_stack_fffffffffffffae8);
  if (cVar1 == '\"') {
    parse_basic_string_only<toml::type_config>(in_stack_00000028,in_stack_00000020);
    bVar2 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
            ::is_ok(&local_b0);
    if (bVar2) {
      result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
      ::unwrap(in_stack_fffffffffffffb48,in_stack_fffffffffffffb50);
      ok<std::__cxx11::string>(in_stack_fffffffffffffb18);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
      ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                *)in_stack_fffffffffffffaf0,(success_type *)in_stack_fffffffffffffae8);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x67bf9d);
    }
    else {
      local_148 = &PTR_s__workspace_llm4binary_github_lic_00964ef0;
      result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
      ::unwrap_err(in_stack_fffffffffffffb48,in_stack_fffffffffffffb50);
      err<toml::error_info>((error_info *)in_stack_fffffffffffffb48);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
      ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                *)in_stack_fffffffffffffaf0,(failure_type *)in_stack_fffffffffffffae8);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x67c04c);
    }
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::~result((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
               *)0x67c089);
  }
  else {
    cVar1 = location::current(in_stack_fffffffffffffae8);
    if (cVar1 == '\'') {
      parse_literal_string_only<toml::type_config>
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      bVar2 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
              ::is_ok(&local_1d8);
      if (bVar2) {
        v = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
            ::unwrap(in_stack_fffffffffffffb48,in_stack_fffffffffffffb50);
        ok<std::__cxx11::string>(&v->first);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  *)in_stack_fffffffffffffaf0,(success_type *)in_stack_fffffffffffffae8);
        success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~success((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x67c14c);
      }
      else {
        result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
        ::unwrap_err(in_stack_fffffffffffffb48,in_stack_fffffffffffffb50);
        err<toml::error_info>((error_info *)in_stack_fffffffffffffb48);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  *)in_stack_fffffffffffffaf0,(failure_type *)in_stack_fffffffffffffae8);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x67c1fb);
      }
      result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
      ::~result((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
                 *)0x67c238);
    }
    else {
      this = &local_2e0;
      syntax::unquoted_key(in_stack_fffffffffffffbb8);
      repeat_at_least::scan(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffffaf0);
      bVar2 = region::operator_cast_to_bool((region *)0x67c2a1);
      if (bVar2) {
        region::as_string_abi_cxx11_((region *)in_stack_fffffffffffffb48);
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb28);
        ok<std::__cxx11::string>(in_stack_fffffffffffffb18);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  *)in_stack_fffffffffffffaf0,(success_type *)in_stack_fffffffffffffae8);
        success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~success((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x67c310);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf0);
      }
      else {
        std::__cxx11::string::string(this);
        if ((local_20->v1_1_0_allow_non_english_in_bare_keys & 1U) == 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28,
                   in_stack_fffffffffffffb20);
        syntax::unquoted_key(in_stack_fffffffffffffbb8);
        location::location(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        std::__cxx11::string::string(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        make_syntax_error<toml::detail::repeat_at_least>
                  (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                   in_stack_fffffffffffffd40);
        in_stack_fffffffffffffaf0 = (region *)(local_431 + 0x79);
        err<toml::error_info>((error_info *)in_stack_fffffffffffffb48);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  *)in_stack_fffffffffffffaf0,(failure_type *)in_stack_fffffffffffffae8);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x67c51c);
        error_info::~error_info((error_info *)in_stack_fffffffffffffaf0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf0);
        location::~location((location *)in_stack_fffffffffffffaf0);
        repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffffaf0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf0);
        std::allocator<char>::~allocator(local_431);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf0);
      }
      region::~region(in_stack_fffffffffffffaf0);
    }
  }
  return in_RDI;
}

Assistant:

result<typename basic_value<TC>::key_type, error_info>
parse_simple_key(location& loc, const context<TC>& ctx)
{
    using key_type = typename basic_value<TC>::key_type;
    const auto& spec = ctx.toml_spec();

    if(loc.current() == '\"')
    {
        auto str_res = parse_basic_string_only(loc, ctx);
        if(str_res.is_ok())
        {
            return ok(std::move(str_res.unwrap().first));
        }
        else
        {
            return err(std::move(str_res.unwrap_err()));
        }
    }
    else if(loc.current() == '\'')
    {
        auto str_res = parse_literal_string_only(loc, ctx);
        if(str_res.is_ok())
        {
            return ok(std::move(str_res.unwrap().first));
        }
        else
        {
            return err(std::move(str_res.unwrap_err()));
        }
    }

    // bare key.

    if(const auto bare = syntax::unquoted_key(spec).scan(loc))
    {
        return ok(string_conv<key_type>(bare.as_string()));
    }
    else
    {
        std::string postfix;
        if(spec.v1_1_0_allow_non_english_in_bare_keys)
        {
            postfix = "Hint: Not all Unicode characters are allowed as bare key.\n";
        }
        else
        {
            postfix = "Hint: non-ASCII scripts are allowed in toml v1.1.0, but not in v1.0.0.\n";
        }
        return err(make_syntax_error("toml::parse_simple_key: "
            "invalid key: key must be \"quoted\", 'quoted-literal', or bare key.",
            syntax::unquoted_key(spec), loc, postfix));
    }
}